

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int str_format(lua_State *L)

{
  byte *__src;
  ushort *puVar1;
  byte bVar2;
  char cVar3;
  int narg;
  byte *pbVar4;
  void *pvVar5;
  ushort **ppuVar6;
  size_t l_00;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  size_t l_01;
  byte *pbVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  byte *pbVar15;
  bool bVar16;
  lua_Number lVar17;
  char form [18];
  size_t l;
  ulong local_2260;
  size_t sfl;
  luaL_Buffer b;
  char buff [512];
  
  local_2260 = (ulong)((long)L->top - (long)L->base) >> 4;
  pbVar4 = (byte *)luaL_checklstring(L,1,&sfl);
  pbVar11 = pbVar4 + sfl;
  b.lvl = 0;
  b.p = b.buffer;
  b.L = L;
  iVar13 = 1;
LAB_0010fd5d:
  while( true ) {
    while( true ) {
      if (pbVar11 <= pbVar4) {
        luaL_pushresult(&b);
        return 1;
      }
      bVar2 = *pbVar4;
      if (bVar2 == 0x25) break;
      if (buff <= b.p) {
        luaL_prepbuffer(&b);
        bVar2 = *pbVar4;
      }
      pbVar4 = pbVar4 + 1;
      *b.p = bVar2;
      b.p = (char *)((byte *)b.p + 1);
    }
    __src = pbVar4 + 1;
    bVar2 = pbVar4[1];
    if (bVar2 != 0x25) break;
    bVar2 = 0x25;
    if (buff <= b.p) {
      luaL_prepbuffer(&b);
      bVar2 = *__src;
    }
    pbVar4 = pbVar4 + 2;
    *b.p = bVar2;
    b.p = (char *)((byte *)b.p + 1);
  }
  narg = iVar13 + 1;
  if ((int)local_2260 <= iVar13) {
    luaL_argerror(L,narg,"no value");
  }
  uVar14 = 0;
  while ((bVar2 != 0 && (pvVar5 = memchr("-+ #0",(int)(char)bVar2,6), pvVar5 != (void *)0x0))) {
    bVar2 = pbVar4[uVar14 + 2];
    uVar14 = uVar14 + 1;
  }
  if (5 < uVar14) {
    pcVar10 = "invalid format (repeated flags)";
LAB_001101a2:
    luaL_error(L,pcVar10);
  }
  ppuVar6 = __ctype_b_loc();
  puVar1 = *ppuVar6;
  uVar8 = (ulong)(puVar1[bVar2] >> 0xb & 1);
  uVar12 = (ulong)(puVar1[pbVar4[uVar14 + 1 + uVar8]] >> 0xb & 1);
  lVar9 = uVar12 + uVar8;
  bVar2 = pbVar4[uVar14 + 1 + lVar9];
  if (bVar2 == 0x2e) {
    lVar9 = uVar8 + uVar12;
    pbVar15 = pbVar4 + uVar14 + 3 + lVar9;
    if ((*(byte *)((long)puVar1 + (ulong)pbVar4[uVar14 + lVar9 + 2] * 2 + 1) & 8) == 0) {
      pbVar15 = pbVar4 + uVar14 + lVar9 + 2;
    }
    pbVar15 = pbVar15 + ((puVar1[*pbVar15] >> 0xb & 1) != 0);
    bVar2 = *pbVar15;
  }
  else {
    pbVar15 = pbVar4 + uVar14 + lVar9 + 1;
  }
  if ((*(byte *)((long)puVar1 + (ulong)bVar2 * 2 + 1) & 8) != 0) {
    pcVar10 = "invalid format (width or precision too long)";
    goto LAB_001101a2;
  }
  form[0] = '%';
  strncpy(form + 1,(char *)__src,(size_t)(pbVar15 + (1 - (long)__src)));
  pbVar15[(long)(form + (2 - (long)__src))] = 0;
  bVar2 = *pbVar15;
  pbVar4 = pbVar15 + 1;
  iVar13 = narg;
  switch(bVar2) {
  case 99:
    lVar17 = luaL_checknumber(L,narg);
    sprintf(buff,form,(ulong)(uint)(int)lVar17);
    goto LAB_0010ff84;
  case 100:
  case 0x69:
    addintlen(form);
    lVar17 = luaL_checknumber(L,narg);
    pcVar10 = (char *)(long)lVar17;
    break;
  case 0x65:
  case 0x66:
  case 0x67:
    goto switchD_0010fee7_caseD_65;
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x70:
  case 0x72:
  case 0x74:
  case 0x76:
  case 0x77:
switchD_0010fee7_caseD_68:
    luaL_error(L,"invalid option \'%%%c\' to \'format\'",(ulong)(uint)(int)(char)bVar2);
  case 0x6f:
  case 0x75:
  case 0x78:
switchD_0010fee7_caseD_6f:
    addintlen(form);
    lVar17 = luaL_checknumber(L,narg);
    pcVar10 = (char *)((long)(lVar17 - 9.223372036854776e+18) & (long)lVar17 >> 0x3f | (long)lVar17)
    ;
    break;
  case 0x71:
    pcVar10 = luaL_checklstring(L,narg,&l);
    if (buff <= b.p) {
      luaL_prepbuffer(&b);
    }
    *b.p = '\"';
    b.p = b.p + 1;
    while (bVar16 = l != 0, l = l - 1, bVar16) {
      cVar3 = *pcVar10;
      if (cVar3 == '\0') {
        pcVar7 = "\\000";
        l_01 = 4;
LAB_00110127:
        luaL_addlstring(&b,pcVar7,l_01);
      }
      else if (cVar3 == '\n') {
LAB_00110094:
        pcVar7 = b.p;
        if (buff <= b.p) {
          luaL_prepbuffer(&b);
          pcVar7 = b.p;
        }
        b.p = pcVar7 + 1;
        *pcVar7 = '\\';
        if (buff <= b.p) {
          luaL_prepbuffer(&b);
        }
        *b.p = *pcVar10;
        b.p = b.p + 1;
      }
      else {
        if (cVar3 == '\r') {
          pcVar7 = "\\r";
          l_01 = 2;
          goto LAB_00110127;
        }
        if ((cVar3 == '\\') || (cVar3 == '\"')) goto LAB_00110094;
        if (buff <= b.p) {
          luaL_prepbuffer(&b);
          cVar3 = *pcVar10;
        }
        *b.p = cVar3;
        b.p = b.p + 1;
      }
      pcVar10 = pcVar10 + 1;
    }
    if (buff <= b.p) {
      luaL_prepbuffer(&b);
    }
    *b.p = '\"';
    b.p = b.p + 1;
    goto LAB_0010fd5d;
  case 0x73:
    pcVar10 = luaL_checklstring(L,narg,&l);
    pcVar7 = strchr(form,0x2e);
    if ((pcVar7 != (char *)0x0) || (l < 100)) break;
    lua_pushvalue(L,narg);
    luaL_addvalue(&b);
    goto LAB_0010fd5d;
  default:
    if ((bVar2 != 0x45) && (bVar2 != 0x47)) {
      if (bVar2 != 0x58) goto switchD_0010fee7_caseD_68;
      goto switchD_0010fee7_caseD_6f;
    }
    goto switchD_0010fee7_caseD_65;
  }
  sprintf(buff,form,pcVar10);
LAB_0010ff84:
  l_00 = strlen(buff);
  luaL_addlstring(&b,buff,l_00);
  goto LAB_0010fd5d;
switchD_0010fee7_caseD_65:
  luaL_checknumber(L,narg);
  sprintf(buff,form);
  goto LAB_0010ff84;
}

Assistant:

static int str_format(lua_State*L){
int top=lua_gettop(L);
int arg=1;
size_t sfl;
const char*strfrmt=luaL_checklstring(L,arg,&sfl);
const char*strfrmt_end=strfrmt+sfl;
luaL_Buffer b;
luaL_buffinit(L,&b);
while(strfrmt<strfrmt_end){
if(*strfrmt!='%')
luaL_addchar(&b,*strfrmt++);
else if(*++strfrmt=='%')
luaL_addchar(&b,*strfrmt++);
else{
char form[(sizeof("-+ #0")+sizeof("l")+10)];
char buff[512];
if(++arg>top)
luaL_argerror(L,arg,"no value");
strfrmt=scanformat(L,strfrmt,form);
switch(*strfrmt++){
case'c':{
sprintf(buff,form,(int)luaL_checknumber(L,arg));
break;
}
case'd':case'i':{
addintlen(form);
sprintf(buff,form,(long)luaL_checknumber(L,arg));
break;
}
case'o':case'u':case'x':case'X':{
addintlen(form);
sprintf(buff,form,(unsigned long)luaL_checknumber(L,arg));
break;
}
case'e':case'E':case'f':
case'g':case'G':{
sprintf(buff,form,(double)luaL_checknumber(L,arg));
break;
}
case'q':{
addquoted(L,&b,arg);
continue;
}
case's':{
size_t l;
const char*s=luaL_checklstring(L,arg,&l);
if(!strchr(form,'.')&&l>=100){
lua_pushvalue(L,arg);
luaL_addvalue(&b);
continue;
}
else{
sprintf(buff,form,s);
break;
}
}
default:{
return luaL_error(L,"invalid option "LUA_QL("%%%c")" to "
LUA_QL("format"),*(strfrmt-1));
}
}
luaL_addlstring(&b,buff,strlen(buff));
}
}
luaL_pushresult(&b);
return 1;
}